

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanEmdeBoasTree.cpp
# Opt level: O3

bool __thiscall VanEmdeBoasTree::predecessor(VanEmdeBoasTree *this,Node *root,int value,int *result)

{
  Node *root_00;
  bool bVar1;
  int *result_00;
  int iVar2;
  double dVar3;
  double dVar4;
  int i;
  int local_3c;
  float local_38;
  int local_34;
  
  if ((value < 0 || root == (Node *)0x0) || (root->uni < value)) goto LAB_001083c9;
  if (root->max < value) {
    *result = root->max;
LAB_00108532:
    bVar1 = true;
  }
  else {
    if (root->summary == (Node *)0x0) {
LAB_00108524:
      iVar2 = root->min;
      if (iVar2 < value) {
LAB_00108530:
        *result = iVar2;
        goto LAB_00108532;
      }
    }
    else {
      dVar3 = log2((double)root->uni);
      dVar3 = floor(dVar3 * 0.5);
      dVar3 = exp2(dVar3);
      dVar4 = log2((double)root->uni);
      dVar4 = floor(dVar4 * 0.5);
      dVar4 = exp2(dVar4);
      iVar2 = (int)((float)value / (float)dVar4);
      local_34 = -0x80000000;
      root_00 = root->cluster[iVar2];
      local_3c = iVar2;
      if ((root_00 == (Node *)0x0) || (value % (int)dVar3 <= root_00->min)) {
        bVar1 = predecessor(this,root->summary,iVar2,&local_3c);
        if (!bVar1) goto LAB_00108524;
        if (root->cluster[local_3c] != (Node *)0x0) {
          result_00 = &root->cluster[local_3c]->max;
          iVar2 = local_3c;
          goto LAB_001084d3;
        }
      }
      else {
        result_00 = &local_34;
        bVar1 = predecessor(this,root_00,value % (int)dVar3,result_00);
        if (bVar1) {
LAB_001084d3:
          local_38 = (float)*result_00;
          dVar3 = log2((double)root->uni);
          dVar3 = floor(dVar3 * 0.5);
          dVar3 = exp2(dVar3);
          iVar2 = (int)((float)dVar3 * (float)iVar2 + local_38);
          goto LAB_00108530;
        }
      }
    }
LAB_001083c9:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool VanEmdeBoasTree::predecessor(Node *root, int value, int &result) {
    if (!root) {
        return false;
    }

    if (value < 0 || value > root->uni) {
        return false;
    }

    if (root->max < value) {
        result = root->max;
        return true;
    }

    if (!root->summary) {
        if (root->min < value) {
            result = root->min;
            return true;
        }
        return false;
    }

    int lowVal = low(root, value);
    int highVal = high(root, value);
    int i = highVal;
    int j = INT_MIN;
    int tmp;
    if (findMin(root->cluster[i], tmp) && lowVal > tmp) {
        if (!predecessor(root->cluster[i], lowVal, j)) {
            return false;
        }
    } else {
        if (!predecessor(root->summary, highVal, i)) {
            if (root->min < value) {
                result = root->min;
                return true;
            }
            return false;
        }
        if (!findMax(root->cluster[i], j)) return false;
    }

    result = index(root, i, j);
    return true;
}